

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

void duckdb_je_thread_tcache_max_set(tsd_t *tsd,size_t tcache_max)

{
  _Bool _Var1;
  tcache_slow_t *ptVar2;
  uint uVar3;
  cache_bin_info_t *info;
  long lVar4;
  cache_bin_info_t duckdb_je_tcache_bin_info [73];
  arena_t *local_d0;
  cache_bin_info_t local_c8 [76];
  
  ptVar2 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).tcache_slow;
  info = local_c8;
  switchD_0105dc25::default(info,0,0x92);
  _Var1 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled;
  if (_Var1 == true) {
    local_d0 = ptVar2->arena;
    lVar4 = 0x1bf;
    do {
      duckdb_je_cache_bin_info_init
                (info,*(cache_bin_sz_t *)
                       (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
                       lVar4 * 2));
      lVar4 = lVar4 + 0xc;
      info = info + 1;
    } while (lVar4 != 0x52b);
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true) {
      tcache_destroy(tsd,&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,true);
      switchD_0105dc25::default
                ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins,0,0x6d8);
    }
  }
  if (tcache_max < 0x1001) {
    uVar3 = (uint)duckdb_je_sz_size2index_tab[tcache_max + 7 >> 3];
  }
  else {
    uVar3 = sz_size2index_compute(tcache_max);
  }
  ptVar2->tcache_nbins = uVar3 + 1;
  if (_Var1 != false) {
    duckdb_je_tsd_tcache_data_init(tsd,local_d0,local_c8);
  }
  return;
}

Assistant:

void
thread_tcache_max_set(tsd_t *tsd, size_t tcache_max) {
	assert(tcache_max <= TCACHE_MAXCLASS_LIMIT);
	assert(tcache_max == sz_s2u(tcache_max));
	tcache_t *tcache = tsd_tcachep_get(tsd);
	tcache_slow_t *tcache_slow = tcache->tcache_slow;
	cache_bin_info_t tcache_bin_info[TCACHE_NBINS_MAX] = {{0}};
	assert(tcache != NULL && tcache_slow != NULL);

	bool enabled = tcache_available(tsd);
	arena_t *assigned_arena;
	if (enabled) {
		assigned_arena = tcache_slow->arena;
		/* Carry over the bin settings during the reboot. */
		tcache_bin_settings_backup(tcache, tcache_bin_info);
		/* Shutdown and reboot the tcache for a clean slate. */
		tcache_cleanup(tsd);
	}

	/*
	* Still set tcache_nbins of the tcache even if the tcache is not
	* available yet because the values are stored in tsd_t and are
	* always available for changing.
	*/
	tcache_max_set(tcache_slow, tcache_max);

	if (enabled) {
		tsd_tcache_data_init(tsd, assigned_arena, tcache_bin_info);
	}

	assert(tcache_nbins_get(tcache_slow) == sz_size2index(tcache_max) + 1);
}